

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool SubtractionHelper<int,_long,_8>::Subtract(int *lhs,long *rhs,int *result)

{
  int iVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 *in_RDX;
  long *in_RSI;
  int *in_RDI;
  int64_t tmp;
  
  lVar2 = (long)*in_RDI - *in_RSI;
  uVar3 = (undefined4)lVar2;
  if (*in_RDI < 0) {
    if (*in_RSI < 0) {
      iVar1 = std::numeric_limits<int>::max();
      if (lVar2 <= iVar1) {
        *in_RDX = uVar3;
        return true;
      }
    }
    else if ((lVar2 <= *in_RDI) && (iVar1 = std::numeric_limits<int>::min(), iVar1 <= lVar2)) {
      *in_RDX = uVar3;
      return true;
    }
  }
  else if (*in_RSI < 0) {
    if ((*in_RDI <= lVar2) && (iVar1 = std::numeric_limits<int>::max(), lVar2 <= iVar1)) {
      *in_RDX = uVar3;
      return true;
    }
  }
  else {
    iVar1 = std::numeric_limits<int>::min();
    if (iVar1 <= lVar2) {
      *in_RDX = uVar3;
      return true;
    }
  }
  return false;
}

Assistant:

static bool Subtract( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // lhs is a 32-bit int or less, rhs std::int64_t
        // we have essentially 4 cases:
        //
        // lhs positive, rhs positive - rhs could be larger than lhs can represent
        // lhs positive, rhs negative - additive case - check tmp >= lhs and tmp > max int
        // lhs negative, rhs positive - check tmp <= lhs and tmp < min int
        // lhs negative, rhs negative - addition cannot internally overflow, check against max

        std::int64_t tmp = (std::int64_t)((std::uint64_t)lhs - (std::uint64_t)rhs);

        if( lhs >= 0 )
        {
            // first case
            if( rhs >= 0 )
            {
                if( tmp >= std::numeric_limits<T>::min() )
                {
                    result = (T)tmp;
                    return true;
                }
            }
            else
            {
                // second case
                if( tmp >= lhs && tmp <= std::numeric_limits<T>::max() )
                {
                    result = (T)tmp;
                    return true;
                }
            }
        }
        else
        {
            // lhs < 0
            // third case
            if( rhs >= 0 )
            {
                if( tmp <= lhs && tmp >= std::numeric_limits<T>::min() )
                {
                    result = (T)tmp;
                    return true;
                }
            }
            else
            {
                // fourth case
                if( tmp <= std::numeric_limits<T>::max() )
                {
                    result = (T)tmp;
                    return true;
                }
            }
        }

        return false;
    }